

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCheck.c
# Opt level: O2

int Cudd_DebugCheck(DdManager *table)

{
  DdManager *pDVar1;
  DdNode *pDVar2;
  int iVar3;
  DdSubtable *pDVar4;
  st__generator *psVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  DdNode **ppDVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  st__table *psVar14;
  uint uVar15;
  DdNode *pDVar16;
  int iVar17;
  DdNode **ppDVar18;
  DdManager *pDVar19;
  st__table **ppsVar20;
  undefined4 uVar21;
  int count;
  DdNode **local_88;
  st__generator *local_80;
  st__table *local_78;
  DdNode **local_70;
  DdManager *local_68;
  DdNode **local_60;
  ulong local_58;
  ulong local_50;
  DdNode **local_48;
  long local_40;
  DdManager *local_38;
  
  local_78 = st__init_table(st__ptrcmp,st__ptrhash);
  iVar17 = -1;
  if (local_78 != (st__table *)0x0) {
    iVar17 = 0;
    uVar8 = 0;
    local_38 = table;
    while (uVar8 < (uint)table->size) {
      local_80 = (st__generator *)(long)table->invperm[uVar8];
      if (uVar8 != (uint)table->perm[(long)local_80]) {
        fprintf((FILE *)table->err,"Permutation corrupted: invperm[%u] = %d\t perm[%d] = %d\n",
                uVar8 & 0xffffffff,local_80,(ulong)(uint)table->invperm[uVar8]);
      }
      local_50 = uVar8 * 0x38;
      local_60 = table->subtables[uVar8].nodelist;
      uVar13 = table->subtables[uVar8].slots;
      ppDVar10 = (DdNode **)0x0;
      local_48 = (DdNode **)(ulong)uVar13;
      if ((int)uVar13 < 1) {
        local_48 = ppDVar10;
      }
      iVar12 = 0;
      local_58 = local_58 & 0xffffffff00000000;
      local_88 = (DdNode **)uVar8;
      for (; uVar8 = local_50, ppDVar18 = local_88, ppDVar10 != local_48;
          ppDVar10 = (DdNode **)((long)ppDVar10 + 1)) {
        ppDVar18 = local_60 + (long)ppDVar10;
        local_70 = ppDVar10;
        while (pDVar19 = (DdManager *)*ppDVar18, local_68 = pDVar19, pDVar19 != table) {
          pDVar16 = (pDVar19->sentinel).type.kids.T;
          if ((pDVar16 == (DdNode *)0x0) || ((pDVar19->sentinel).type.kids.E == (DdNode *)0x0)) {
LAB_0073bb3d:
            fwrite("Error: node has illegal Then or Else pointers\n",0x2e,1,(FILE *)table->err);
            cuddPrintNode((DdNode *)pDVar19,table->err);
            iVar17 = 1;
            ppDVar10 = local_70;
          }
          else if ((pDVar19->sentinel).ref == 0) {
            if ((pDVar19->sentinel).ref != 0) goto LAB_0073bb3d;
            local_58 = CONCAT44(local_58._4_4_,(int)local_58 + 1);
          }
          else {
            iVar7 = 1;
            if ((pDVar19->sentinel).index != (DdHalfWord)local_80) {
              fwrite("Error: node has illegal index\n",0x1e,1,(FILE *)table->err);
              cuddPrintNode((DdNode *)pDVar19,table->err);
              pDVar16 = (pDVar19->sentinel).type.kids.T;
              iVar17 = iVar7;
            }
            uVar8 = 0x7fffffff;
            if ((ulong)pDVar16->index != 0x7fffffff) {
              uVar8 = (ulong)(uint)table->perm[pDVar16->index];
            }
            if (local_88 < uVar8) {
              uVar8 = (ulong)*(uint *)((ulong)(pDVar19->sentinel).type.kids.E & 0xfffffffffffffffe);
              uVar9 = 0x7fffffff;
              if (uVar8 != 0x7fffffff) {
                uVar9 = (ulong)(uint)table->perm[uVar8];
              }
              if (uVar9 <= local_88) goto LAB_0073b9bb;
            }
            else {
LAB_0073b9bb:
              fwrite("Error: node has illegal children\n",0x21,1,(FILE *)table->err);
              cuddPrintNode((DdNode *)pDVar19,table->err);
              pDVar16 = (pDVar19->sentinel).type.kids.T;
              iVar17 = iVar7;
            }
            if (((ulong)pDVar16 & 1) != 0) {
              fwrite("Error: node has illegal form\n",0x1d,1,(FILE *)table->err);
              cuddPrintNode((DdNode *)pDVar19,table->err);
              pDVar16 = (pDVar19->sentinel).type.kids.T;
              iVar17 = iVar7;
            }
            if (pDVar16 == (pDVar19->sentinel).type.kids.E) {
              fwrite("Error: node has identical children\n",0x23,1,(FILE *)table->err);
              cuddPrintNode((DdNode *)pDVar19,table->err);
              pDVar16 = (pDVar19->sentinel).type.kids.T;
              iVar17 = iVar7;
            }
            if ((pDVar16->ref == 0) ||
               (*(int *)(((ulong)(pDVar19->sentinel).type.kids.E & 0xfffffffffffffffe) + 4) == 0)) {
              fwrite("Error: live node has dead children\n",0x23,1,(FILE *)table->err);
              cuddPrintNode((DdNode *)pDVar19,table->err);
              pDVar16 = (pDVar19->sentinel).type.kids.T;
              iVar17 = iVar7;
            }
            iVar3 = st__lookup_int(local_78,(char *)pDVar16,&count);
            pDVar19 = local_68;
            psVar14 = local_78;
            iVar6 = iVar7;
            if (iVar3 != 0) {
              iVar6 = count + 1;
            }
            count = iVar6;
            iVar6 = st__insert(local_78,(char *)(local_68->sentinel).type.kids.T,(char *)(long)iVar6
                              );
            if (iVar6 == -10000) goto LAB_0073bfbe;
            iVar6 = st__lookup_int(psVar14,(char *)((ulong)(pDVar19->sentinel).type.kids.E &
                                                   0xfffffffffffffffe),&count);
            if (iVar6 != 0) {
              iVar7 = count + 1;
            }
            count = iVar7;
            iVar7 = st__insert(local_78,(char *)((ulong)(pDVar19->sentinel).type.kids.E &
                                                0xfffffffffffffffe),(char *)(long)iVar7);
            ppDVar10 = local_70;
            psVar14 = local_78;
            table = local_38;
            if (iVar7 == -10000) goto LAB_0073bfbe;
          }
          iVar12 = iVar12 + 1;
          ppDVar18 = &(pDVar19->sentinel).next;
        }
      }
      pDVar4 = table->subtables;
      if (iVar12 != *(int *)((long)&pDVar4->keys + local_50)) {
        fwrite("Error: wrong number of total nodes\n",0x23,1,(FILE *)table->err);
        pDVar4 = table->subtables;
        iVar17 = 1;
      }
      if ((int)local_58 != *(int *)((long)&pDVar4->dead + uVar8)) {
        fwrite("Error: wrong number of dead nodes\n",0x22,1,(FILE *)table->err);
        iVar17 = 1;
      }
      uVar8 = (long)ppDVar18 + 1;
    }
    uVar8 = 0;
    while (uVar8 < (uint)table->sizeZ) {
      local_88 = (DdNode **)(long)table->invpermZ[uVar8];
      if (uVar8 != (uint)table->permZ[(long)local_88]) {
        fprintf((FILE *)table->err,
                "Permutation corrupted: invpermZ[%u] = %d\t permZ[%d] = %d in ZDD\n",
                uVar8 & 0xffffffff,local_88,(ulong)(uint)table->invpermZ[uVar8]);
      }
      local_40 = uVar8 * 0x38;
      local_48 = table->subtableZ[uVar8].nodelist;
      uVar13 = table->subtableZ[uVar8].slots;
      uVar9 = 0;
      local_50 = (ulong)uVar13;
      if ((int)uVar13 < 1) {
        local_50 = uVar9;
      }
      iVar12 = 0;
      local_60 = (DdNode **)((ulong)local_60 & 0xffffffff00000000);
      local_80 = (st__generator *)uVar8;
      while (uVar9 != local_50) {
        ppDVar10 = local_48 + uVar9;
        local_58 = uVar9;
        while (pDVar19 = (DdManager *)*ppDVar10, pDVar19 != (DdManager *)0x0) {
          pDVar16 = (pDVar19->sentinel).type.kids.T;
          local_68 = pDVar19;
          if ((pDVar16 == (DdNode *)0x0) || ((pDVar19->sentinel).type.kids.E == (DdNode *)0x0)) {
LAB_0073befe:
            fwrite("Error: ZDD node has illegal Then or Else pointers\n",0x32,1,(FILE *)table->err);
            cuddPrintNode((DdNode *)pDVar19,table->err);
            iVar17 = 1;
          }
          else if ((pDVar19->sentinel).ref == 0) {
            if ((pDVar19->sentinel).ref != 0) goto LAB_0073befe;
            local_60 = (DdNode **)CONCAT44(local_60._4_4_,(int)local_60 + 1);
          }
          else {
            local_70 = (DdNode **)CONCAT44(local_70._4_4_,iVar12);
            if ((pDVar19->sentinel).index != (DdHalfWord)local_88) {
              fwrite("Error: ZDD node has illegal index\n",0x22,1,(FILE *)table->err);
              cuddPrintNode((DdNode *)pDVar19,table->err);
              pDVar16 = (pDVar19->sentinel).type.kids.T;
              iVar17 = 1;
            }
            psVar5 = local_80;
            if ((((ulong)pDVar16 & 1) != 0) ||
               ((undefined1  [16])
                ((undefined1  [16])(pDVar19->sentinel).type & (undefined1  [16])0x1) !=
                (undefined1  [16])0x0)) {
              fwrite("Error: ZDD node has complemented children\n",0x2a,1,(FILE *)table->err);
              cuddPrintNode((DdNode *)pDVar19,table->err);
              pDVar16 = (pDVar19->sentinel).type.kids.T;
              iVar17 = 1;
            }
            uVar8 = 0x7fffffff;
            if ((ulong)pDVar16->index != 0x7fffffff) {
              uVar8 = (ulong)(uint)table->permZ[pDVar16->index];
            }
            if (psVar5 < uVar8) {
              uVar8 = (ulong)((pDVar19->sentinel).type.kids.E)->index;
              uVar9 = 0x7fffffff;
              if (uVar8 != 0x7fffffff) {
                uVar9 = (ulong)(uint)table->permZ[uVar8];
              }
              if (uVar9 <= psVar5) goto LAB_0073bda9;
            }
            else {
LAB_0073bda9:
              fwrite("Error: ZDD node has illegal children\n",0x25,1,(FILE *)table->err);
              cuddPrintNode((DdNode *)pDVar19,table->err);
              cuddPrintNode((pDVar19->sentinel).type.kids.T,table->err);
              cuddPrintNode((pDVar19->sentinel).type.kids.E,table->err);
              pDVar16 = (pDVar19->sentinel).type.kids.T;
              iVar17 = 1;
            }
            if (pDVar16 == table->zero) {
              fwrite("Error: ZDD node has zero then child\n",0x24,1,(FILE *)table->err);
              cuddPrintNode((DdNode *)pDVar19,table->err);
              pDVar16 = (pDVar19->sentinel).type.kids.T;
              iVar17 = 1;
            }
            if ((pDVar16->ref == 0) || (((pDVar19->sentinel).type.kids.E)->ref == 0)) {
              fwrite("Error: ZDD live node has dead children\n",0x27,1,(FILE *)table->err);
              cuddPrintNode((DdNode *)pDVar19,table->err);
              pDVar16 = (pDVar19->sentinel).type.kids.T;
              iVar17 = 1;
            }
            psVar14 = local_78;
            iVar12 = st__lookup_int(local_78,(char *)pDVar16,&count);
            pDVar19 = local_68;
            count = count + 1;
            if (iVar12 == 0) {
              count = 1;
            }
            iVar12 = st__insert(psVar14,(char *)(local_68->sentinel).type.kids.T,(char *)(long)count
                               );
            if (iVar12 == -10000) {
LAB_0073bfbe:
              st__free_table(psVar14);
              return -1;
            }
            iVar12 = st__lookup_int(psVar14,(char *)(pDVar19->sentinel).type.kids.E,&count);
            count = count + 1;
            if (iVar12 == 0) {
              count = 1;
            }
            iVar7 = st__insert(psVar14,(char *)(pDVar19->sentinel).type.kids.E,(char *)(long)count);
            iVar12 = (int)local_70;
            if (iVar7 == -10000) {
              st__free_table(local_78);
              table->errorCode = CUDD_MEMORY_OUT;
              return -1;
            }
          }
          iVar12 = iVar12 + 1;
          ppDVar10 = &(pDVar19->sentinel).next;
        }
        local_68 = (DdManager *)0x0;
        uVar9 = local_58 + 1;
      }
      pDVar4 = table->subtableZ;
      if (iVar12 != *(int *)((long)&pDVar4->keys + local_40)) {
        fwrite("Error: wrong number of total nodes in ZDD\n",0x2a,1,(FILE *)table->err);
        pDVar4 = table->subtableZ;
        iVar17 = 1;
      }
      if ((int)local_60 != *(int *)((long)&pDVar4->dead + local_40)) {
        fwrite("Error: wrong number of dead nodes in ZDD\n",0x29,1,(FILE *)table->err);
        iVar17 = 1;
      }
      uVar8 = (long)local_80 + 1;
    }
    uVar13 = (table->constants).slots;
    ppDVar10 = (DdNode **)0x0;
    local_88 = (DdNode **)(ulong)uVar13;
    if ((int)uVar13 < 1) {
      local_88 = ppDVar10;
    }
    local_80 = (st__generator *)(table->constants).nodelist;
    uVar13 = 0;
    uVar15 = 0;
    while (ppDVar10 != local_88) {
      ppsVar20 = &local_80->table + (long)ppDVar10;
      local_70 = ppDVar10;
      while (pDVar19 = (DdManager *)*ppsVar20, pDVar19 != (DdManager *)0x0) {
        if ((pDVar19->sentinel).ref == 0) {
          uVar15 = uVar15 + 1;
        }
        else if ((pDVar19->sentinel).index != 0x7fffffff) {
          local_68 = pDVar19;
          fwrite("Error: node has illegal index\n",0x1e,1,(FILE *)table->err);
          fprintf((FILE *)table->err,"       node 0x%lx, id = %u, ref = %u, value = %g\n",
                  (int)*(undefined8 *)&(pDVar19->sentinel).type,pDVar19,
                  (ulong)(pDVar19->sentinel).index,(ulong)(pDVar19->sentinel).ref);
          iVar17 = 1;
        }
        uVar13 = uVar13 + 1;
        ppsVar20 = (st__table **)&(pDVar19->sentinel).next;
      }
      local_68 = (DdManager *)0x0;
      ppDVar10 = (DdNode **)((long)local_70 + 1);
    }
    if (uVar13 != (table->constants).keys) {
      fwrite("Error: wrong number of total nodes in constants\n",0x30,1,(FILE *)table->err);
      iVar17 = 1;
    }
    if (uVar15 != (table->constants).dead) {
      fwrite("Error: wrong number of dead nodes in constants\n",0x2f,1,(FILE *)table->err);
      iVar17 = 1;
    }
    psVar14 = local_78;
    psVar5 = st__init_gen(local_78);
    while (iVar12 = st__gen(psVar5,(char **)&local_68,(char **)&count), iVar12 != 0) {
      uVar13 = (local_68->sentinel).ref;
      if (uVar13 != 0xffffffff && (int)uVar13 < count) {
        uVar21 = *(undefined4 *)((long)&(local_68->sentinel).type + 8);
        local_80 = psVar5;
        fprintf((FILE *)table->err,
                "ref count error at node 0x%lx, count = %d, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n"
                ,local_68,(ulong)(uint)count,(ulong)(local_68->sentinel).index,(ulong)uVar13,
                (local_68->sentinel).type.value,uVar21);
        pDVar19 = local_68;
        ppDVar10 = (DdNode **)0x0;
        while( true ) {
          uVar8 = (ulong)(pDVar19->sentinel).index;
          lVar11 = 0x7fffffff;
          if (uVar8 != 0x7fffffff) {
            lVar11 = (long)table->perm[uVar8];
          }
          if (lVar11 <= (long)ppDVar10) break;
          local_70 = table->subtables[(long)ppDVar10].nodelist;
          uVar13 = table->subtables[(long)ppDVar10].slots;
          if ((int)uVar13 < 1) {
            uVar13 = 0;
          }
          local_88 = ppDVar10;
          for (uVar8 = 0; uVar8 != uVar13; uVar8 = uVar8 + 1) {
            ppDVar10 = local_70 + uVar8;
            while (pDVar16 = *ppDVar10, pDVar16 != (DdNode *)0x0) {
              pDVar1 = (DdManager *)(pDVar16->type).kids.T;
              pDVar2 = (pDVar16->type).kids.E;
              if ((pDVar1 == pDVar19) ||
                 (pDVar19 == (DdManager *)((ulong)pDVar2 & 0xfffffffffffffffe))) {
                fprintf((FILE *)table->out,
                        "parent is at 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                        pDVar16,(ulong)pDVar16->index,(ulong)pDVar16->ref,pDVar1,pDVar2,uVar21);
              }
              ppDVar10 = &pDVar16->next;
            }
          }
          ppDVar10 = (DdNode **)((long)local_88 + 1);
        }
        iVar17 = 1;
        psVar14 = local_78;
        psVar5 = local_80;
      }
    }
    st__free_gen(psVar5);
    st__free_table(psVar14);
  }
  return iVar17;
}

Assistant:

int
Cudd_DebugCheck(
  DdManager * table)
{
    unsigned int i;
    int         j,count;
    int         slots;
    DdNodePtr   *nodelist;
    DdNode      *f;
    DdNode      *sentinel = &(table->sentinel);
    st__table    *edgeTable;     /* stores internal ref count for each node */
    st__generator        *gen;
    int         flag = 0;
    int         totalNode;
    int         deadNode;
    int         index;


    edgeTable = st__init_table( st__ptrcmp, st__ptrhash);
    if (edgeTable == NULL) return(CUDD_OUT_OF_MEM);

    /* Check the BDD/ADD subtables. */
    for (i = 0; i < (unsigned) table->size; i++) {
        index = table->invperm[i];
        if (i != (unsigned) table->perm[index]) {
            (void) fprintf(table->err,
                           "Permutation corrupted: invperm[%u] = %d\t perm[%d] = %d\n",
                           i, index, index, table->perm[index]);
        }
        nodelist = table->subtables[i].nodelist;
        slots = table->subtables[i].slots;

        totalNode = 0;
        deadNode = 0;
        for (j = 0; j < slots; j++) {   /* for each subtable slot */
            f = nodelist[j];
            while (f != sentinel) {
                totalNode++;
                if (cuddT(f) != NULL && cuddE(f) != NULL && f->ref != 0) {
                    if ((int) f->index != index) {
                        (void) fprintf(table->err,
                                       "Error: node has illegal index\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if ((unsigned) cuddI(table,cuddT(f)->index) <= i ||
                        (unsigned) cuddI(table,Cudd_Regular(cuddE(f))->index)
                        <= i) {
                        (void) fprintf(table->err,
                                       "Error: node has illegal children\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (Cudd_Regular(cuddT(f)) != cuddT(f)) {
                        (void) fprintf(table->err,
                                       "Error: node has illegal form\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (cuddT(f) == cuddE(f)) {
                        (void) fprintf(table->err,
                                       "Error: node has identical children\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (cuddT(f)->ref == 0 || Cudd_Regular(cuddE(f))->ref == 0) {
                        (void) fprintf(table->err,
                                       "Error: live node has dead children\n");
                        cuddPrintNode(f,table->err);
                        flag =1;
                    }
                    /* Increment the internal reference count for the
                    ** then child of the current node.
                    */
                    if ( st__lookup_int(edgeTable,(char *)cuddT(f),&count)) {
                        count++;
                    } else {
                        count = 1;
                    }
                    if ( st__insert(edgeTable,(char *)cuddT(f),
                    (char *)(long)count) == st__OUT_OF_MEM) {
                        st__free_table(edgeTable);
                        return(CUDD_OUT_OF_MEM);
                    }

                    /* Increment the internal reference count for the
                    ** else child of the current node.
                    */
                    if ( st__lookup_int(edgeTable,(char *)Cudd_Regular(cuddE(f)),
                                      &count)) {
                        count++;
                    } else {
                        count = 1;
                    }
                    if ( st__insert(edgeTable,(char *)Cudd_Regular(cuddE(f)),
                    (char *)(long)count) == st__OUT_OF_MEM) {
                        st__free_table(edgeTable);
                        return(CUDD_OUT_OF_MEM);
                    }
                } else if (cuddT(f) != NULL && cuddE(f) != NULL && f->ref == 0) {
                    deadNode++;
#if 0
                    debugCheckParent(table,f);
#endif
                } else {
                    fprintf(table->err,
                            "Error: node has illegal Then or Else pointers\n");
                    cuddPrintNode(f,table->err);
                    flag = 1;
                }

                f = f->next;
            }   /* for each element of the collision list */
        }       /* for each subtable slot */

        if ((unsigned) totalNode != table->subtables[i].keys) {
            fprintf(table->err,"Error: wrong number of total nodes\n");
            flag = 1;
        }
        if ((unsigned) deadNode != table->subtables[i].dead) {
            fprintf(table->err,"Error: wrong number of dead nodes\n");
            flag = 1;
        }
    }   /* for each BDD/ADD subtable */

    /* Check the ZDD subtables. */
    for (i = 0; i < (unsigned) table->sizeZ; i++) {
        index = table->invpermZ[i];
        if (i != (unsigned) table->permZ[index]) {
            (void) fprintf(table->err,
                           "Permutation corrupted: invpermZ[%u] = %d\t permZ[%d] = %d in ZDD\n",
                           i, index, index, table->permZ[index]);
        }
        nodelist = table->subtableZ[i].nodelist;
        slots = table->subtableZ[i].slots;

        totalNode = 0;
        deadNode = 0;
        for (j = 0; j < slots; j++) {   /* for each subtable slot */
            f = nodelist[j];
            while (f != NULL) {
                totalNode++;
                if (cuddT(f) != NULL && cuddE(f) != NULL && f->ref != 0) {
                    if ((int) f->index != index) {
                        (void) fprintf(table->err,
                                       "Error: ZDD node has illegal index\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (Cudd_IsComplement(cuddT(f)) ||
                        Cudd_IsComplement(cuddE(f))) {
                        (void) fprintf(table->err,
                                       "Error: ZDD node has complemented children\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if ((unsigned) cuddIZ(table,cuddT(f)->index) <= i ||
                    (unsigned) cuddIZ(table,cuddE(f)->index) <= i) {
                        (void) fprintf(table->err,
                                       "Error: ZDD node has illegal children\n");
                        cuddPrintNode(f,table->err);
                        cuddPrintNode(cuddT(f),table->err);
                        cuddPrintNode(cuddE(f),table->err);
                        flag = 1;
                    }
                    if (cuddT(f) == DD_ZERO(table)) {
                        (void) fprintf(table->err,
                                       "Error: ZDD node has zero then child\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (cuddT(f)->ref == 0 || cuddE(f)->ref == 0) {
                        (void) fprintf(table->err,
                                       "Error: ZDD live node has dead children\n");
                        cuddPrintNode(f,table->err);
                        flag =1;
                    }
                    /* Increment the internal reference count for the
                    ** then child of the current node.
                    */
                    if ( st__lookup_int(edgeTable,(char *)cuddT(f),&count)) {
                        count++;
                    } else {
                        count = 1;
                    }
                    if ( st__insert(edgeTable,(char *)cuddT(f),
                    (char *)(long)count) == st__OUT_OF_MEM) {
                        st__free_table(edgeTable);
                        return(CUDD_OUT_OF_MEM);
                    }

                    /* Increment the internal reference count for the
                    ** else child of the current node.
                    */
                    if ( st__lookup_int(edgeTable,(char *)cuddE(f),&count)) {
                        count++;
                    } else {
                        count = 1;
                    }
                    if ( st__insert(edgeTable,(char *)cuddE(f),
                    (char *)(long)count) == st__OUT_OF_MEM) {
                        st__free_table(edgeTable);
                        table->errorCode = CUDD_MEMORY_OUT;
                        return(CUDD_OUT_OF_MEM);
                    }
                } else if (cuddT(f) != NULL && cuddE(f) != NULL && f->ref == 0) {
                    deadNode++;
#if 0
                    debugCheckParent(table,f);
#endif
                } else {
                    fprintf(table->err,
                            "Error: ZDD node has illegal Then or Else pointers\n");
                    cuddPrintNode(f,table->err);
                    flag = 1;
                }

                f = f->next;
            }   /* for each element of the collision list */
        }       /* for each subtable slot */

        if ((unsigned) totalNode != table->subtableZ[i].keys) {
            fprintf(table->err,
                    "Error: wrong number of total nodes in ZDD\n");
            flag = 1;
        }
        if ((unsigned) deadNode != table->subtableZ[i].dead) {
            fprintf(table->err,
                    "Error: wrong number of dead nodes in ZDD\n");
            flag = 1;
        }
    }   /* for each ZDD subtable */

    /* Check the constant table. */
    nodelist = table->constants.nodelist;
    slots = table->constants.slots;

    totalNode = 0;
    deadNode = 0;
    for (j = 0; j < slots; j++) {
        f = nodelist[j];
        while (f != NULL) {
            totalNode++;
            if (f->ref != 0) {
                if (f->index != CUDD_CONST_INDEX) {
                    fprintf(table->err,"Error: node has illegal index\n");
#if SIZEOF_VOID_P == 8
                    fprintf(table->err,
                            "       node 0x%lx, id = %u, ref = %u, value = %g\n",
                            (ptruint)f,f->index,f->ref,cuddV(f));
#else
                    fprintf(table->err,
                            "       node 0x%x, id = %hu, ref = %hu, value = %g\n",
                            (ptruint)f,f->index,f->ref,cuddV(f));
#endif
                    flag = 1;
                }
            } else {
                deadNode++;
            }
            f = f->next;
        }
    }
    if ((unsigned) totalNode != table->constants.keys) {
        (void) fprintf(table->err,
                       "Error: wrong number of total nodes in constants\n");
        flag = 1;
    }
    if ((unsigned) deadNode != table->constants.dead) {
        (void) fprintf(table->err,
                       "Error: wrong number of dead nodes in constants\n");
        flag = 1;
    }
    gen = st__init_gen(edgeTable);
    while ( st__gen(gen, (const char **)&f, (char **)&count)) {
        if (count > (int)(f->ref) && f->ref != DD_MAXREF) {
#if SIZEOF_VOID_P == 8
            fprintf(table->err,"ref count error at node 0x%lx, count = %d, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",(ptruint)f,count,f->index,f->ref,(ptruint)cuddT(f),(ptruint)cuddE(f));
#else
            fprintf(table->err,"ref count error at node 0x%x, count = %d, id = %hu, ref = %hu, then = 0x%x, else = 0x%x\n",(ptruint)f,count,f->index,f->ref,(ptruint)cuddT(f),(ptruint)cuddE(f));
#endif
            debugFindParent(table,f);
            flag = 1;
        }
    }
    st__free_gen(gen);
    st__free_table(edgeTable);

    return (flag);

}